

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O0

SUNErrCode
SUNAdaptController_EstimateStep
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  undefined8 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  SUNContext sunctx_local_scope_;
  SUNErrCode ier;
  undefined4 local_34;
  undefined4 local_4;
  
  local_34 = 0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    *in_RDX = in_XMM0_Qa;
    if (*(long *)(*(long *)(in_RDI + 8) + 8) != 0) {
      local_34 = (**(code **)(*(long *)(in_RDI + 8) + 8))
                           (in_XMM0_Qa,in_XMM1_Qa,in_RDI,in_ESI,in_RDX);
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep(SUNAdaptController C, sunrealtype h,
                                           int p, sunrealtype dsm,
                                           sunrealtype* hnew)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(isfinite(h), SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(p >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(dsm >= SUN_RCONST(0.0), SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(hnew, SUN_ERR_ARG_CORRUPT);
  *hnew = h; /* initialize output with identity */
  if (C->ops->estimatestep) { ier = C->ops->estimatestep(C, h, p, dsm, hnew); }
  return (ier);
}